

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session.c
# Opt level: O1

LINK_ENDPOINT_HANDLE session_create_link_endpoint(SESSION_HANDLE session,char *name)

{
  uint32_t uVar1;
  LINK_ENDPOINT_HANDLE __ptr;
  size_t sVar2;
  char *__dest;
  LINK_ENDPOINT_INSTANCE **ppLVar3;
  LOGGER_LOG p_Var4;
  uint uVar5;
  ulong uVar6;
  handle hVar7;
  ulong uVar8;
  SESSION_INSTANCE *session_instance;
  
  if (name != (char *)0x0 && session != (SESSION_HANDLE)0x0) {
    __ptr = (LINK_ENDPOINT_HANDLE)calloc(1,0x50);
    uVar8 = 0;
    if (__ptr != (LINK_ENDPOINT_HANDLE)0x0) {
      uVar6 = (ulong)session->link_endpoint_count;
      if (uVar6 != 0) {
        uVar8 = 0;
        do {
          if ((uint)uVar8 < session->link_endpoints[uVar8]->output_handle) goto LAB_0011a6a8;
          uVar8 = uVar8 + 1;
        } while (uVar6 != uVar8);
        uVar8 = (ulong)session->link_endpoint_count;
      }
LAB_0011a6a8:
      __ptr->on_session_flow_on = (ON_SESSION_FLOW_ON)0x0;
      __ptr->callback_context = (void *)0x0;
      __ptr->frame_received_callback = (ON_ENDPOINT_FRAME_RECEIVED)0x0;
      __ptr->on_session_state_changed = (ON_SESSION_STATE_CHANGED)0x0;
      hVar7 = (handle)uVar8;
      __ptr->output_handle = hVar7;
      __ptr->input_handle = 0xffffffff;
      __ptr->link_endpoint_state = LINK_ENDPOINT_STATE_NOT_ATTACHED;
      sVar2 = strlen(name);
      __dest = (char *)malloc(sVar2 + 1);
      __ptr->name = __dest;
      __ptr->on_link_endpoint_destroyed_callback = (ON_LINK_ENDPOINT_DESTROYED_CALLBACK)0x0;
      __ptr->on_link_endpoint_destroyed_context = (void *)0x0;
      if (__dest != (char *)0x0) {
        memcpy(__dest,name,sVar2 + 1);
        __ptr->session = session;
        sVar2 = uVar6 * 0x50 + 0x50;
        ppLVar3 = (LINK_ENDPOINT_INSTANCE **)realloc(session->link_endpoints,sVar2);
        if (ppLVar3 != (LINK_ENDPOINT_INSTANCE **)0x0) {
          session->link_endpoints = ppLVar3;
          uVar1 = session->link_endpoint_count;
          uVar5 = uVar1 - hVar7;
          if (uVar5 != 0) {
            memmove(ppLVar3 + (hVar7 + 1),ppLVar3 + (uVar8 & 0xffffffff),(ulong)uVar5 << 3);
          }
          ppLVar3[uVar8 & 0xffffffff] = __ptr;
          session->link_endpoint_count = uVar1 + 1;
          return __ptr;
        }
        p_Var4 = xlogging_get_log_function();
        if (p_Var4 != (LOGGER_LOG)0x0) {
          (*p_Var4)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/session.c"
                    ,"session_create_link_endpoint",0x487,1,
                    "Cannot realloc new_link_endpoints, size:%zu",sVar2);
        }
        free(__ptr->name);
      }
      free(__ptr);
    }
  }
  return (LINK_ENDPOINT_HANDLE)0x0;
}

Assistant:

LINK_ENDPOINT_HANDLE session_create_link_endpoint(SESSION_HANDLE session, const char* name)
{
    LINK_ENDPOINT_INSTANCE* result;

    /* Codes_S_R_S_SESSION_01_044: [If session, name or frame_received_callback is NULL, session_create_link_endpoint shall fail and return NULL.] */
    if ((session == NULL) ||
        (name == NULL))
    {
        result = NULL;
    }
    else
    {
        /* Codes_S_R_S_SESSION_01_043: [session_create_link_endpoint shall create a link endpoint associated with a given session and return a non-NULL handle to it.] */
        SESSION_INSTANCE* session_instance = (SESSION_INSTANCE*)session;

        result = (LINK_ENDPOINT_INSTANCE*)calloc(1, sizeof(LINK_ENDPOINT_INSTANCE));
        /* Codes_S_R_S_SESSION_01_045: [If allocating memory for the link endpoint fails, session_create_link_endpoint shall fail and return NULL.] */
        if (result != NULL)
        {
            /* Codes_S_R_S_SESSION_01_046: [An unused handle shall be assigned to the link endpoint.] */
            handle selected_handle = 0;
            size_t i;
            size_t name_length;

            for (i = 0; i < session_instance->link_endpoint_count; i++)
            {
                if (session_instance->link_endpoints[i]->output_handle > selected_handle)
                {
                    break;
                }

                selected_handle++;
            }

            result->on_session_state_changed = NULL;
            result->on_session_flow_on = NULL;
            result->frame_received_callback = NULL;
            result->callback_context = NULL;
            result->output_handle = selected_handle;
            result->input_handle = 0xFFFFFFFF;
            result->link_endpoint_state = LINK_ENDPOINT_STATE_NOT_ATTACHED;
            name_length = strlen(name);
            result->name = (char*)malloc(name_length + 1);
            result->on_link_endpoint_destroyed_callback = NULL;
            result->on_link_endpoint_destroyed_context = NULL;
            if (result->name == NULL)
            {
                /* Codes_S_R_S_SESSION_01_045: [If allocating memory for the link endpoint fails, session_create_link_endpoint shall fail and return NULL.] */
                free(result);
                result = NULL;
            }
            else
            {
                LINK_ENDPOINT_INSTANCE** new_link_endpoints;
                (void)memcpy(result->name, name, name_length + 1);
                result->session = session;

                size_t realloc_size = safe_add_size_t((size_t)session_instance->link_endpoint_count, 1);
                realloc_size = safe_multiply_size_t(realloc_size, sizeof(LINK_ENDPOINT_INSTANCE));
                if (realloc_size == SIZE_MAX ||
                    (new_link_endpoints = (LINK_ENDPOINT_INSTANCE**)realloc(session_instance->link_endpoints, realloc_size)) == NULL)
                {
                    /* Codes_S_R_S_SESSION_01_045: [If allocating memory for the link endpoint fails, session_create_link_endpoint shall fail and return NULL.] */
                    LogError("Cannot realloc new_link_endpoints, size:%zu", realloc_size);
                    free(result->name);
                    free(result);
                    result = NULL;
                }
                else
                {
                    session_instance->link_endpoints = new_link_endpoints;

                    if (session_instance->link_endpoint_count - selected_handle > 0)
                    {
                        (void)memmove(&session_instance->link_endpoints[selected_handle + 1], &session_instance->link_endpoints[selected_handle], (session_instance->link_endpoint_count - selected_handle) * sizeof(LINK_ENDPOINT_INSTANCE*));
                    }

                    session_instance->link_endpoints[selected_handle] = result;
                    session_instance->link_endpoint_count++;
                }
            }
        }
    }

    return result;
}